

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

int __thiscall icu_63::FixedDecimal::init(FixedDecimal *this,EVP_PKEY_CTX *ctx)

{
  UBool UVar1;
  int64_t in_RDX;
  double in_XMM0_Qa;
  long local_30;
  int64_t fdwtz;
  int64_t f_local;
  int32_t v_local;
  double n_local;
  FixedDecimal *this_local;
  
  f_local._4_4_ = (int32_t)ctx;
  this->isNegative = in_XMM0_Qa < 0.0;
  this->source = ABS(in_XMM0_Qa);
  UVar1 = uprv_isNaN_63(this->source);
  this->_isNaN = UVar1;
  UVar1 = uprv_isInfinite_63(this->source);
  this->_isInfinite = UVar1;
  if ((this->_isNaN == '\0') && (this->_isInfinite == '\0')) {
    this->intValue = (long)this->source;
    this->_hasIntegerValue = this->source == (double)this->intValue;
    fdwtz = in_RDX;
  }
  else {
    f_local._4_4_ = 0;
    fdwtz = 0;
    this->intValue = 0;
    this->_hasIntegerValue = '\0';
  }
  this->visibleDecimalDigitCount = f_local._4_4_;
  this->decimalDigits = fdwtz;
  if (fdwtz == 0) {
    this->decimalDigitsWithoutTrailingZeros = 0;
  }
  else {
    for (local_30 = fdwtz; local_30 % 10 == 0; local_30 = local_30 / 10) {
    }
    this->decimalDigitsWithoutTrailingZeros = local_30;
  }
  return (int)this;
}

Assistant:

void FixedDecimal::init(double n, int32_t v, int64_t f) {
    isNegative = n < 0.0;
    source = fabs(n);
    _isNaN = uprv_isNaN(source);
    _isInfinite = uprv_isInfinite(source);
    if (_isNaN || _isInfinite) {
        v = 0;
        f = 0;
        intValue = 0;
        _hasIntegerValue = FALSE;
    } else {
        intValue = (int64_t)source;
        _hasIntegerValue = (source == intValue);
    }

    visibleDecimalDigitCount = v;
    decimalDigits = f;
    if (f == 0) {
         decimalDigitsWithoutTrailingZeros = 0;
    } else {
        int64_t fdwtz = f;
        while ((fdwtz%10) == 0) {
            fdwtz /= 10;
        }
        decimalDigitsWithoutTrailingZeros = fdwtz;
    }
}